

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiWindow *pIVar4;
  bool bVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  long lVar11;
  ImGuiContext *g;
  uint uVar12;
  char cVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  ImVec2 IVar17;
  
  pIVar7 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  bVar14 = (flags & 7U) == 0;
  uVar6 = (uint)bVar14 + flags + 0x20;
  if ((flags & 0x3f0U) != 0) {
    uVar6 = (uint)bVar14 | flags;
  }
  pIVar4 = pIVar7->HoveredWindow;
  if (pIVar4 == (ImGuiWindow *)0x0 || (uVar6 >> 0xb & 1) == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = pIVar4->RootWindow == window;
  }
  if (bVar14) {
    pIVar7->HoveredWindow = window;
  }
  bVar8 = ItemHoverable(bb,id);
  if (((bVar8) && (pIVar7->DragDropActive == true)) && ((pIVar7->DragDropPayload).SourceId == id)) {
    bVar8 = (bool)(bVar8 & ((byte)pIVar7->DragDropSourceFlags & 2) >> 1);
  }
  bVar9 = false;
  if (((uVar6 >> 9 & 1) != 0) && (pIVar7->DragDropActive != false)) {
    if (((pIVar7->DragDropSourceFlags & 4) == 0) && (bVar9 = IsItemHovered(0x80), bVar9)) {
      SetHoveredID(id);
      bVar8 = true;
      bVar9 = false;
      if ((0.7 <= pIVar7->HoveredIdTimer) &&
         (bVar9 = false, pIVar7->HoveredIdTimer - (pIVar7->IO).DeltaTime <= 0.7)) {
        pIVar7->DragDropHoldJustPressedId = id;
        FocusWindow(window);
        bVar8 = true;
        bVar9 = true;
      }
    }
    else {
      bVar9 = false;
    }
  }
  if (bVar14) {
    pIVar7->HoveredWindow = pIVar4;
  }
  if (bVar8 == true && (uVar6 >> 0xc & 1) != 0) {
    bVar8 = (bool)(bVar8 & (pIVar7->HoveredIdPreviousFrame == 0 ||
                           pIVar7->HoveredIdPreviousFrame == id));
  }
  if (bVar8 != false) {
    if (((uVar6 >> 0x10 & 1) == 0) ||
       ((((pIVar7->IO).KeyCtrl == false && ((pIVar7->IO).KeyShift == false)) &&
        ((pIVar7->IO).KeyAlt == false)))) {
      if ((uVar6 & 1) == 0) {
LAB_0015a3db:
        if (((uVar6 & 2) == 0) || ((pIVar7->IO).MouseClicked[1] == false)) {
          if ((uVar6 & 4) == 0) {
            uVar12 = 0xffffffff;
            bVar10 = 1;
          }
          else {
            bVar10 = (pIVar7->IO).MouseClicked[2] ^ 1;
            uVar12 = -(uint)bVar10 | 2;
          }
        }
        else {
          uVar12 = 1;
          bVar10 = 0;
        }
      }
      else {
        bVar10 = 0;
        uVar12 = 0;
        if ((pIVar7->IO).MouseClicked[0] == false) goto LAB_0015a3db;
      }
      if (((uVar6 & 1) == 0) || ((pIVar7->IO).MouseReleased[0] == false)) {
        if (((uVar6 & 2) == 0) || ((pIVar7->IO).MouseReleased[1] == false)) {
          lVar11 = 0xffffffff;
          if ((uVar6 & 4) == 0) {
            cVar13 = '\0';
          }
          else {
            cVar13 = (pIVar7->IO).MouseReleased[2];
            if ((bool)cVar13 != false) {
              lVar11 = 2;
            }
          }
        }
        else {
          lVar11 = 1;
          cVar13 = '\x01';
        }
      }
      else {
        cVar13 = '\x01';
        lVar11 = 0;
      }
      if ((bVar10 == 0) && (pIVar7->ActiveId != id)) {
        if ((uVar6 & 0x60) != 0) {
          SetActiveID(id,window);
          pIVar7->ActiveIdMouseButton = uVar12;
          if ((uVar6 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          FocusWindow(window);
        }
        if (((uVar6 & 0x10) != 0) ||
           (((uVar6 >> 8 & 1) != 0 && ((pIVar7->IO).MouseClickedCount[uVar12] == 2)))) {
          if ((uVar6 >> 0x11 & 1) == 0) {
            SetActiveID(id,window);
          }
          else {
            ClearActiveID();
          }
          if ((uVar6 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          pIVar7->ActiveIdMouseButton = uVar12;
          FocusWindow(window);
          bVar9 = true;
        }
      }
      if (cVar13 == '\x01' && (char)(byte)uVar6 < '\0') {
        bVar14 = true;
        if (((uVar6 >> 10 & 1) != 0) &&
           (bVar14 = true, (pIVar7->IO).KeyRepeatDelay <= (pIVar7->IO).MouseDownDurationPrev[lVar11]
           )) {
          bVar14 = bVar9;
        }
        if ((uVar6 >> 0x12 & 1) == 0) {
          SetFocusID(id,window);
        }
        ClearActiveID();
        bVar9 = bVar14;
      }
      if (((((uVar6 >> 10 & 1) != 0) && (pIVar7->ActiveId == id)) &&
          (0.0 < (pIVar7->IO).MouseDownDuration[pIVar7->ActiveIdMouseButton])) &&
         (bVar14 = IsMouseClicked(pIVar7->ActiveIdMouseButton,true), bVar14)) {
        bVar9 = true;
      }
    }
    if (bVar9) {
      pIVar7->NavDisableHighlight = true;
    }
  }
  if (((pIVar7->NavId == id) && (pIVar7->NavDisableHighlight == false)) &&
     (pIVar7->NavDisableMouseHover == true)) {
    IVar2 = pIVar7->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar6 >> 0x13 & 1) == 0) {
LAB_0015a64d:
        bVar8 = true;
      }
    }
    else if (((uVar6 >> 0x13 & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_0015a64d;
  }
  if ((pIVar7->NavActivateDownId == id) &&
     ((IVar2 = pIVar7->NavActivateId,
      fVar16 = GetNavInputAmount(0,(uVar6 >> 9 & 2) + ImGuiInputReadMode_Pressed), IVar2 == id ||
      (0.0 < fVar16)))) {
    SetActiveID(id,window);
    pIVar7->ActiveIdSource = ImGuiInputSource_Nav;
    bVar9 = true;
    if ((uVar6 >> 0x12 & 1) == 0) {
      SetFocusID(id,window);
      bVar9 = true;
    }
  }
  if (pIVar7->ActiveId != id) {
    bVar14 = false;
    goto LAB_0015a7cd;
  }
  if (pIVar7->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar7->NavActivateDownId != id) {
      ClearActiveID();
    }
LAB_0015a734:
    bVar14 = false;
  }
  else {
    if (pIVar7->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0015a734;
    if (pIVar7->ActiveIdIsJustActivated == true) {
      IVar1 = (pIVar7->IO).MousePos;
      IVar17.x = IVar1.x - (bb->Min).x;
      IVar17.y = IVar1.y - (bb->Min).y;
      pIVar7->ActiveIdClickOffset = IVar17;
    }
    iVar3 = pIVar7->ActiveIdMouseButton;
    bVar14 = true;
    if ((pIVar7->IO).MouseDown[iVar3] == false) {
      bVar14 = bVar9;
      if ((((uVar6 & 0x40) != 0) || (((byte)uVar6 >> 5 & bVar8) != 0)) &&
         (pIVar7->DragDropActive == false)) {
        if (((uVar6 >> 8 & 1) == 0) || ((pIVar7->IO).MouseReleased[iVar3] != true)) {
          bVar15 = false;
        }
        else {
          bVar15 = (pIVar7->IO).MouseClickedLastCount[iVar3] == 2;
        }
        if ((uVar6 >> 10 & 1) == 0) {
          bVar5 = false;
        }
        else {
          bVar5 = (pIVar7->IO).KeyRepeatDelay <= (pIVar7->IO).MouseDownDurationPrev[iVar3];
        }
        if ((!bVar15) && (bVar14 = true, bVar5)) {
          bVar14 = bVar9;
        }
      }
      bVar9 = bVar14;
      ClearActiveID();
      bVar14 = false;
    }
    if ((uVar6 >> 0x12 & 1) == 0) {
      pIVar7->NavDisableHighlight = true;
    }
  }
  if (bVar9 != false) {
    pIVar7->ActiveIdHasBeenPressedBefore = true;
  }
LAB_0015a7cd:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar8;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar14;
  }
  return bVar9;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}